

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::handle(Fl_Input *this,int event)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Fl_Window *pFVar14;
  int iVar15;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *src;
  uint p;
  Fl_Boxtype FVar16;
  
  iVar13 = handle::dnd_save_mark;
  switch(event) {
  case 1:
    bVar6 = Fl::option(OPTION_DND_TEXT);
    if (bVar6) {
      iVar13 = (this->super_Fl_Input_).super_Fl_Widget.x_;
      iVar15 = (this->super_Fl_Input_).position_;
      iVar4 = (this->super_Fl_Input_).mark_;
      bVar1 = (this->super_Fl_Input_).super_Fl_Widget.box_;
      FVar16 = (Fl_Boxtype)bVar1;
      iVar11 = Fl::box_dx(FVar16);
      iVar5 = (this->super_Fl_Input_).super_Fl_Widget.y_;
      iVar12 = Fl::box_dy((uint)bVar1);
      iVar9 = (this->super_Fl_Input_).super_Fl_Widget.w_;
      iVar7 = Fl::box_dw(FVar16);
      iVar10 = (this->super_Fl_Input_).super_Fl_Widget.h_;
      iVar8 = Fl::box_dh(FVar16);
      Fl_Input_::handle_mouse
                (&this->super_Fl_Input_,iVar13 + iVar11,iVar5 + iVar12,iVar9 - iVar7,iVar10 - iVar8,
                 0);
      handle::newpos = (this->super_Fl_Input_).position_;
      Fl_Input_::position(&this->super_Fl_Input_,iVar15,iVar4);
      if ((((Fl::focus_ == (Fl_Widget *)this) && ((Fl::e_state & 0x10000U) == 0)) &&
          (((this->super_Fl_Input_).super_Fl_Widget.type_ & 7) != 5)) &&
         (handle::newpos < (this->super_Fl_Input_).position_ !=
          handle::newpos < (this->super_Fl_Input_).mark_)) {
        handle::drag_start = handle::newpos;
        return 1;
      }
      handle::drag_start = -1;
    }
    if (Fl::focus_ != (Fl_Widget *)this) {
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    if (Fl::e_keysym == 0xfeea) {
      Fl::e_is_click = 0;
      Fl::paste((Fl_Widget *)this,0);
      goto LAB_001ba06a;
    }
    if (Fl::e_is_click != 0) {
      in_RDX = (EVP_PKEY_CTX *)(ulong)(uint)handle::drag_start;
      if (-1 < handle::drag_start) {
        Fl_Input_::position(&this->super_Fl_Input_,handle::drag_start,handle::drag_start);
        handle::drag_start = -1;
        goto LAB_001ba06a;
      }
      if (Fl::e_clicks == 0) goto LAB_001ba06a;
    }
    Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)0x0,in_RDX);
LAB_001ba06a:
    if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) != 0) {
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Input_).super_Fl_Widget.user_data_);
    }
    return 1;
  case 3:
  case 4:
  case 7:
    break;
  case 5:
    bVar6 = Fl::option(OPTION_DND_TEXT);
    if ((bVar6) && (-1 < handle::drag_start)) {
      if (Fl::e_is_click != 0) {
        return 1;
      }
      handle::dnd_save_position = (this->super_Fl_Input_).position_;
      handle::dnd_save_mark = (this->super_Fl_Input_).mark_;
      handle::dnd_save_focus = (Fl_Widget *)this;
      Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)0x0,src);
      Fl::dnd();
      return 1;
    }
    break;
  case 6:
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar15 = (this->super_Fl_Input_).size_;
      iVar13 = iVar15;
      break;
    case 0xff52:
      iVar13 = Fl_Input_::line_start(&this->super_Fl_Input_,(this->super_Fl_Input_).size_);
      goto LAB_001b9f96;
    case 0xff53:
      iVar13 = 0;
LAB_001b9f73:
      iVar15 = 0;
      break;
    case 0xff54:
      iVar13 = 0;
LAB_001b9f96:
      Fl_Input_::up_down_position(&this->super_Fl_Input_,iVar13,0);
      goto switchD_001b9adf_caseD_3;
    default:
      if (Fl::e_keysym == 0xff09) {
        iVar13 = (this->super_Fl_Input_).size_;
        goto LAB_001b9f73;
      }
      iVar15 = (this->super_Fl_Input_).mark_;
      iVar13 = (this->super_Fl_Input_).position_;
    }
    Fl_Input_::position(&this->super_Fl_Input_,iVar13,iVar15);
    break;
  case 8:
    if ((((Fl::e_keysym == 0xff09) &&
         ((Fl::e_state & 0x10000U) == 0 && (this->super_Fl_Input_).tab_nav_ == 0)) &&
        (((this->super_Fl_Input_).super_Fl_Widget.type_ & 7) == 4)) &&
       (uVar2 = (this->super_Fl_Input_).size_, 0 < (int)uVar2)) {
      p = (this->super_Fl_Input_).position_;
      uVar3 = (this->super_Fl_Input_).mark_;
      if ((p == uVar2 && uVar3 == 0) || (uVar2 == uVar3 && p == 0)) {
        if (p < uVar3) {
          p = uVar3;
        }
        Fl_Input_::position(&this->super_Fl_Input_,p,p);
        return 1;
      }
    }
    iVar13 = Fl_Widget::active_r((Fl_Widget *)this);
    if (((iVar13 != 0) &&
        (pFVar14 = Fl_Widget::window((Fl_Widget *)this), pFVar14 != (Fl_Window *)0x0)) &&
       (Fl::belowmouse_ == (Fl_Widget *)this)) {
      pFVar14 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar14,FL_CURSOR_NONE);
    }
    iVar13 = handle_key(this);
    return iVar13;
  default:
    switch(event) {
    case 0x14:
      Fl::belowmouse((Fl_Widget *)this);
      if (handle::dnd_save_focus != (Fl_Widget *)this) {
        handle::dnd_save_position = (this->super_Fl_Input_).position_;
        handle::dnd_save_mark = (this->super_Fl_Input_).mark_;
        handle::dnd_save_focus = Fl::focus_;
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
    case 0x15:
      bVar1 = (this->super_Fl_Input_).super_Fl_Widget.box_;
      FVar16 = (Fl_Boxtype)bVar1;
      iVar13 = (this->super_Fl_Input_).super_Fl_Widget.x_;
      iVar9 = Fl::box_dx(FVar16);
      iVar15 = (this->super_Fl_Input_).super_Fl_Widget.y_;
      iVar10 = Fl::box_dy((uint)bVar1);
      iVar4 = (this->super_Fl_Input_).super_Fl_Widget.w_;
      iVar11 = Fl::box_dw(FVar16);
      iVar5 = (this->super_Fl_Input_).super_Fl_Widget.h_;
      iVar12 = Fl::box_dh(FVar16);
      Fl_Input_::handle_mouse
                (&this->super_Fl_Input_,iVar13 + iVar9,iVar15 + iVar10,iVar4 - iVar11,iVar5 - iVar12
                 ,0);
      return 1;
    case 0x16:
      Fl_Input_::position(&this->super_Fl_Input_,handle::dnd_save_position,handle::dnd_save_mark);
      if (handle::dnd_save_focus != (Fl_Widget *)this && handle::dnd_save_focus != (Fl_Widget *)0x0)
      {
        Fl::focus(handle::dnd_save_focus);
        (*(this->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[3])(this,7);
      }
      pFVar14 = Fl::first_window();
      Fl_Window::cursor(pFVar14,FL_CURSOR_MOVE);
      handle::dnd_save_focus = (Fl_Widget *)0x0;
      return 1;
    case 0x17:
      if (handle::dnd_save_focus == (Fl_Widget *)this) {
        iVar15 = (this->super_Fl_Input_).position_;
        if (handle::dnd_save_position < handle::dnd_save_mark) {
          handle::dnd_save_mark = handle::dnd_save_position;
          handle::dnd_save_position = iVar13;
        }
        Fl_Input_::replace(&this->super_Fl_Input_,handle::dnd_save_mark,handle::dnd_save_position,
                           (char *)0x0,0);
        if (handle::dnd_save_position < iVar15) {
          iVar15 = (handle::dnd_save_mark - handle::dnd_save_position) + iVar15;
        }
        Fl_Input_::position(&this->super_Fl_Input_,iVar15,iVar15);
      }
      else if (handle::dnd_save_focus != (Fl_Widget *)0x0) {
        (*handle::dnd_save_focus->_vptr_Fl_Widget[3])(handle::dnd_save_focus,7);
      }
      handle::dnd_save_focus = (Fl_Widget *)0x0;
      Fl_Widget::take_focus((Fl_Widget *)this);
      return 1;
    }
  }
switchD_001b9adf_caseD_3:
  bVar1 = (this->super_Fl_Input_).super_Fl_Widget.box_;
  FVar16 = (Fl_Boxtype)bVar1;
  iVar13 = (this->super_Fl_Input_).super_Fl_Widget.x_;
  iVar9 = Fl::box_dx(FVar16);
  iVar15 = (this->super_Fl_Input_).super_Fl_Widget.y_;
  iVar10 = Fl::box_dy((uint)bVar1);
  iVar4 = (this->super_Fl_Input_).super_Fl_Widget.w_;
  iVar11 = Fl::box_dw(FVar16);
  iVar5 = (this->super_Fl_Input_).super_Fl_Widget.h_;
  iVar12 = Fl::box_dh(FVar16);
  iVar13 = Fl_Input_::handletext
                     (&this->super_Fl_Input_,event,iVar13 + iVar9,iVar15 + iVar10,iVar4 - iVar11,
                      iVar5 - iVar12);
  return iVar13;
}

Assistant:

int Fl_Input::handle(int event) {
  static int dnd_save_position, dnd_save_mark, drag_start = -1, newpos;
  static Fl_Widget *dnd_save_focus = NULL;
  switch (event) {
#ifdef __APPLE__
    case FL_UNFOCUS:
      if (Fl::compose_state) {
	this->mark( this->position() );
	Fl::reset_marked_text();
      }
      break;
#endif
    case FL_FOCUS:
      switch (Fl::event_key()) {
        case FL_Right:
          position(0);
          break;
        case FL_Left:
          position(size());
          break;
        case FL_Down:
          up_down_position(0);
          break;
        case FL_Up:
          up_down_position(line_start(size()));
          break;
        case FL_Tab:
          position(size(),0);
          break;
        default:
          position(position(),mark());// turns off the saved up/down arrow position
          break;
      }
      break;
      
    case FL_KEYBOARD:
      // Handle special case for multiline input with 'old tab behavior'
      // where tab is entered as a character: make sure user attempt to 'tab over'
      // widget doesn't destroy the field, replacing it with a tab character.
      //
      if (Fl::event_key() == FL_Tab 			// Tab key?
          && !Fl::event_state(FL_SHIFT)			// no shift?
          && !tab_nav()					// with tab navigation disabled?
	  && input_type() == FL_MULTILINE_INPUT		// with a multiline input?
	  && size() > 0                                 // non-empty field?
          && ((mark()==0 && position()==size()) || (position()==0 && mark()==size()))) {// while entire field selected?
        // Set cursor to the end of the selection...
        if (mark() > position())
          position(mark());
        else
          position(position());
        return (1);
      } else {
        if (active_r() && window() && this == Fl::belowmouse()) 
          window()->cursor(FL_CURSOR_NONE);
        return handle_key();
      }
      //NOTREACHED
      
    case FL_PUSH:
      if (Fl::dnd_text_ops()) {
        int oldpos = position(), oldmark = mark();
        Fl_Boxtype b = box();
        Fl_Input_::handle_mouse(x()+Fl::box_dx(b), y()+Fl::box_dy(b),
                                w()-Fl::box_dw(b), h()-Fl::box_dh(b), 0);
        newpos = position(); 
        position( oldpos, oldmark );
        if (Fl::focus()==this && !Fl::event_state(FL_SHIFT) && input_type()!=FL_SECRET_INPUT &&
           ( (newpos >= mark() && newpos < position()) || 
             (newpos >= position() && newpos < mark()) ) ) {
          // user clicked in the selection, may be trying to drag
          drag_start = newpos;
          return 1;
        }
        drag_start = -1;
      }
      
      if (Fl::focus() != this) {
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      break;
      
    case FL_DRAG:
      if (Fl::dnd_text_ops()) {
        if (drag_start >= 0) {
          if (Fl::event_is_click()) return 1; // debounce the mouse
                                              // save the position because sometimes we don't get DND_ENTER:
          dnd_save_position = position();
          dnd_save_mark = mark();
	  dnd_save_focus = this;
          // drag the data:
          copy(0);
#ifdef __APPLE__
          Fl_X::dnd(1);
#else
          Fl::dnd();
#endif
          return 1;
        }
      }
      break;
      
    case FL_RELEASE:
      if (Fl::event_button() == 2) {
        Fl::event_is_click(0); // stop double click from picking a word
        Fl::paste(*this, 0);
      } else if (!Fl::event_is_click()) {
        // copy drag-selected text to the clipboard.
        copy(0);
      } else if (Fl::event_is_click() && drag_start >= 0) {
        // user clicked in the field and wants to reset the cursor position...
        position(drag_start, drag_start);
        drag_start = -1;
      } else if (Fl::event_clicks()) {
        // user double or triple clicked to select word or whole text
        copy(0);
      }
      
      // For output widgets, do the callback so the app knows the user
      // did something with the mouse...
      if (readonly()) do_callback();
      
      return 1;
      
    case FL_DND_ENTER:
      Fl::belowmouse(this); // send the leave events first
      if (dnd_save_focus != this) {
	dnd_save_position = position();
	dnd_save_mark = mark();
	dnd_save_focus = Fl::focus();
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      // fall through:
    case FL_DND_DRAG: 
      //int p = mouse_position(X, Y, W, H);
#ifdef DND_OUT_XXXX
      if (Fl::focus()==this && (p>=dnd_save_position && p<=dnd_save_mark ||
                                p>=dnd_save_mark && p<=dnd_save_position)) {
        position(dnd_save_position, dnd_save_mark);
        return 0;
      }
#endif
      {
        Fl_Boxtype b = box();
        Fl_Input_::handle_mouse(x()+Fl::box_dx(b), y()+Fl::box_dy(b),
                                w()-Fl::box_dw(b), h()-Fl::box_dh(b), 0);
      }
      return 1;
      
    case FL_DND_LEAVE:
      position(dnd_save_position, dnd_save_mark);
#ifdef DND_OUT_XXXX
      if (!focused())
#endif
        if (dnd_save_focus && dnd_save_focus != this) {
          Fl::focus(dnd_save_focus);
          handle(FL_UNFOCUS);
        }
#if !(defined(__APPLE__) || defined(WIN32))
      Fl::first_window()->cursor(FL_CURSOR_MOVE);
#endif
      dnd_save_focus = NULL;
      return 1;
      
    case FL_DND_RELEASE:
      if (dnd_save_focus == this) { // if the dragged text comes from the same widget
	// remove the selected text
	int old_position = position();
	if (dnd_save_mark > dnd_save_position) {
	  int tmp = dnd_save_mark;
	  dnd_save_mark = dnd_save_position;
	  dnd_save_position = tmp;
	  }
	replace(dnd_save_mark, dnd_save_position, NULL, 0);
	if (old_position > dnd_save_position) position(old_position - (dnd_save_position - dnd_save_mark));
	else position(old_position);
	}
      else if(dnd_save_focus) {
	dnd_save_focus->handle(FL_UNFOCUS);
	}
      dnd_save_focus = NULL;
      take_focus();
      return 1;
      
      /* TODO: this will scroll the area, but stop if the cursor would become invisible.
       That clipping happens in drawtext(). Do we change the clipping or should 
       we move the cursor (ouch)?
       case FL_MOUSEWHEEL:
       if (Fl::e_dy > 0) {
       yscroll( yscroll() - Fl::e_dy*15 );
       } else if (Fl::e_dy < 0) {
       yscroll( yscroll() - Fl::e_dy*15 );
       }
       return 1;
       */
  }
  Fl_Boxtype b = box();
  return Fl_Input_::handletext(event,
                               x()+Fl::box_dx(b), y()+Fl::box_dy(b),
                               w()-Fl::box_dw(b), h()-Fl::box_dh(b));
}